

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O1

void do_offer(CHAR_DATA *ch,char *argument)

{
  ROOM_INDEX_DATA *pRVar1;
  OBJ_DATA **ppOVar2;
  bool bVar3;
  int iVar4;
  OBJ_DATA *obj;
  char *pcVar5;
  MYSQL_RES *pMVar6;
  long lVar7;
  OBJ_DATA *arg2;
  char query [4608];
  char local_1228 [4608];
  
  arg2 = object_list;
  if (object_list != (OBJ_DATA *)0x0) {
    do {
      pRVar1 = arg2->in_room;
      if (((pRVar1 != (ROOM_INDEX_DATA *)0x0) && (arg2->item_type == 0x29)) &&
         (pRVar1 == ch->in_room)) {
        if ((pRVar1->owner != (char *)0x0) && (bVar3 = str_cmp(pRVar1->owner,""), bVar3)) {
          bVar3 = str_cmp(argument,"");
          if (!bVar3) {
            sprintf(local_1228,
                    "SELECT * FROM offerings WHERE deity = \"%s\" AND player = \"%s\" ORDER BY time DESC LIMIT 1"
                    ,arg2->in_room->owner,ch->true_name);
            pMVar6 = one_query_res(local_1228);
            lVar7 = mysql_fetch_row(pMVar6);
            mysql_free_result(pMVar6);
            if (lVar7 == 0) {
              pcVar5 = "You find no signs of any offerings you may have made.\n\r";
              goto LAB_002d623a;
            }
            iVar4 = atoi(*(char **)(lVar7 + 0x20));
            if (iVar4 == 0) {
              pcVar5 = 
              "The pile of offerings doesn\'t appear to have been disturbed since your last visit.\n\r"
              ;
              goto LAB_002d623a;
            }
            if (iVar4 == 1) {
              pcVar5 = 
              "The other offerings that were here have been accepted, but yours has been left untouched.\n\r"
              ;
              goto LAB_002d623a;
            }
            if (iVar4 == 2) {
              pcVar5 = "Your offering seems to have been accepted.\n\r";
              goto LAB_002d623a;
            }
          }
          obj = get_obj_carry(ch,argument,ch);
          if (obj == (OBJ_DATA *)0x0) {
            pcVar5 = "You don\'t have that item.\n\r";
          }
          else {
            bVar3 = can_drop_obj(ch,obj);
            if (bVar3) {
              pcVar5 = escape_string(obj->short_descr);
              sprintf(local_1228,
                      "INSERT INTO offerings VALUES(\"%s\", %d, \"%s\", \'%s\', 0, %ld, nullptr)",
                      arg2->in_room->owner,(ulong)(uint)(int)obj->pIndexData->vnum,pcVar5,
                      ch->true_name,current_time);
              one_query(local_1228);
              act("You place $p on $P, offering it to your deity.",ch,obj,arg2,3);
              act("$n places $s offering of $p on $P.",ch,obj,arg2,0);
              extract_obj(obj);
              return;
            }
            pcVar5 = "You can\'t let go of it.\n\r";
          }
LAB_002d623a:
          send_to_char(pcVar5,ch);
          return;
        }
        break;
      }
      ppOVar2 = &arg2->next;
      arg2 = *ppOVar2;
    } while (*ppOVar2 != (OBJ_DATA *)0x0);
  }
  send_to_char("There\'s no altar here.\n\r",ch);
  return;
}

Assistant:

void do_offer(CHAR_DATA *ch, char *argument)
{
	MYSQL_ROW row;
	OBJ_DATA *obj, *altar;
	char query[MSL];
	char *escape;
	int status;

	// status: 0 unread 1 rejected 2 accepted
	for (altar = object_list; altar; altar = altar->next)
	{
		if (altar->in_room && altar->item_type == ITEM_ALTAR && altar->in_room == ch->in_room)
			break;
	}

	if (!altar || !altar->in_room->owner || !str_cmp(altar->in_room->owner, ""))
	{
		send_to_char("There's no altar here.\n\r", ch);
		return;
	}

	if (!str_cmp(argument, ""))
	{
		sprintf(query, "SELECT * FROM offerings WHERE deity = \"%s\" AND player = \"%s\" ORDER BY time DESC LIMIT 1",
			altar->in_room->owner,
			ch->true_name);

		row = one_query_row(query);

		if (!row)
		{
			send_to_char("You find no signs of any offerings you may have made.\n\r", ch);
			return;
		}

		status = atoi(row[4]);
		if (status == 2)
		{
			send_to_char("Your offering seems to have been accepted.\n\r", ch);
			return;
		}

		if (status == 1)
		{
			send_to_char("The other offerings that were here have been accepted, but yours has been left untouched.\n\r", ch);
			return;
		}

		if (status == 0)
		{
			send_to_char("The pile of offerings doesn't appear to have been disturbed since your last visit.\n\r", ch);
			return;
		}
	}

	obj = get_obj_carry(ch, argument, ch);

	if (!obj)
	{
		send_to_char("You don't have that item.\n\r", ch);
		return;
	}

	if (!can_drop_obj(ch, obj))
	{
		send_to_char("You can't let go of it.\n\r", ch);
		return;
	}

	escape = escape_string(obj->short_descr);

	sprintf(query, "INSERT INTO offerings VALUES(\"%s\", %d, \"%s\", '%s', 0, %ld, nullptr)",
		altar->in_room->owner,
		obj->pIndexData->vnum,
		escape,
		ch->true_name,
		current_time);
	one_query(query);

	act("You place $p on $P, offering it to your deity.", ch, obj, altar, TO_CHAR);
	act("$n places $s offering of $p on $P.", ch, obj, altar, TO_ROOM);

	extract_obj(obj);
}